

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

double __thiscall soplex::SPxScaler<double>::minAbsColscale(SPxScaler<double> *this)

{
  DataArray<int> *pDVar1;
  double dVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 local_28 [16];
  
  pDVar1 = this->m_activeColscaleExp;
  ::soplex::infinity::__tls_init();
  local_28._0_8_ = *(double *)(in_FS_OFFSET + -8);
  local_28._8_8_ = 0;
  if (0 < pDVar1->thesize) {
    lVar4 = 0;
    do {
      dVar2 = ldexp(1.0,pDVar1->data[lVar4]);
      if (ABS(dVar2) < (double)local_28._0_8_) {
        dVar2 = ldexp(1.0,pDVar1->data[lVar4]);
        uVar3 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
        local_28._8_4_ = (int)uVar3;
        local_28._0_8_ = ABS(dVar2);
        local_28._12_4_ = (int)(uVar3 >> 0x20);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pDVar1->thesize);
  }
  return (double)local_28._0_8_;
}

Assistant:

R SPxScaler<R>::minAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R mini = R(infinity);

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) < mini)
         mini = spxAbs(spxLdexp(1.0, colscaleExp[i]));

   return mini;
}